

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignReader.cpp
# Opt level: O1

void __thiscall adios2::core::engine::CampaignReader::EndStep(CampaignReader *this)

{
  ostream *poVar1;
  
  if (this->m_NeedPerformGets == true) {
    PerformGets(this);
  }
  if (1 < (this->m_Options).verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Campaign Reader ",0x10);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,this->m_ReaderRank);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"   EndStep()\n",0xd);
    return;
  }
  return;
}

Assistant:

void CampaignReader::EndStep()
{
    // EndStep should call PerformGets() if there are unserved GetDeferred()
    // requests
    if (m_NeedPerformGets)
    {
        PerformGets();
    }

    if (m_Options.verbose > 1)
    {
        std::cout << "Campaign Reader " << m_ReaderRank << "   EndStep()\n";
    }
}